

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_wString ON_SubDEndCapStyleToString(ON_SubDEndCapStyle subd_cap_style,bool bVerbose)

{
  undefined7 in_register_00000039;
  wchar_t *local_20;
  wchar_t *s;
  bool bVerbose_local;
  ON_SubDEndCapStyle subd_cap_style_local;
  
  switch(bVerbose) {
  case false:
    local_20 = L"Unset";
    break;
  case true:
    local_20 = L"None";
    break;
  case true:
    local_20 = L"Triangles";
    break;
  case true:
    local_20 = L"Quads";
    break;
  case true:
    local_20 = L"Ngon";
    break;
  default:
    local_20 = L"invalid";
  }
  ON_wString::ON_wString((ON_wString *)CONCAT71(in_register_00000039,subd_cap_style),local_20);
  return (ON_wString)(wchar_t *)CONCAT71(in_register_00000039,subd_cap_style);
}

Assistant:

const ON_wString ON_SubDEndCapStyleToString(
  ON_SubDEndCapStyle subd_cap_style,
  bool bVerbose
)
{
  const wchar_t* s;
  switch (subd_cap_style)
  {
  case ON_SubDEndCapStyle::Unset:
    s = L"Unset";
    break;
  case ON_SubDEndCapStyle::None:
    s = L"None";
    break;
  case ON_SubDEndCapStyle::Triangles:
    s = L"Triangles";
    break;
  case ON_SubDEndCapStyle::Quads:
    s = L"Quads";
    break;
  case ON_SubDEndCapStyle::Ngon:
    s = L"Ngon";
    break;
  default:
    s = L"invalid";
    break;
  }

  return ON_wString(s);
}